

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satClause.h
# Opt level: O2

int Sat_MemCompactLearned(Sat_Mem_t *p,int fDoMove)

{
  byte bVar1;
  cla h;
  int **ppiVar2;
  Sat_Mem_t *pSVar3;
  bool bVar4;
  uint uVar5;
  clause *pcVar6;
  clause *__src;
  uint uVar7;
  clause cVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  clause local_48;
  
  bVar1 = (byte)p->nPageSize;
  uVar9 = p->iPage[1] << (bVar1 & 0x1f) | *p->pPages[p->iPage[1]];
  uVar5 = 1 << (bVar1 & 0x1f) | 2;
  if (uVar9 == uVar5) {
    return 0;
  }
  if ((fDoMove != 0) && (h = p->BookMarkH[1], h != 0)) {
    if ((h < (int)uVar5) || ((int)uVar9 < h)) {
      __assert_fail("p->BookMarkH[1] >= Sat_MemHand(p, 1, 2) && p->BookMarkH[1] <= hLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                    ,0x179,"int Sat_MemCompactLearned(Sat_Mem_t *, int)");
    }
    pcVar6 = Sat_MemClauseHand(p,h);
    if (((int)uVar9 <= p->BookMarkH[1]) || (((uint)*pcVar6 & 2) != 0)) goto LAB_00719661;
    *(clause *)(p->BookMarkH + 1) = pcVar6[(ulong)((uint)*pcVar6 >> 0xb) + 1];
  }
  pcVar6 = (clause *)0x0;
LAB_00719661:
  bVar4 = false;
  uVar14 = 1;
  uVar13 = 1;
  uVar5 = 2;
  local_48 = (clause)0x0;
  do {
    if ((long)p->iPage[1] < (long)uVar14) {
      if (fDoMove != 0) {
        *(clause *)(p->nEntries + 1) = local_48;
        p->iPage[1] = (int)uVar13;
        ppiVar2 = p->pPages;
        *ppiVar2[(int)uVar13] = uVar5;
        if (p->BookMarkH[1] != 0) {
          if (pcVar6 == (clause *)0x0) {
            pcVar6 = Sat_MemClauseHand(p,p->BookMarkH[1]);
            pSVar3 = (Sat_Mem_t *)(pcVar6 + ((uint)*pcVar6 >> 0xb));
          }
          else {
            p->BookMarkH[1] = p->iPage[1] << ((byte)p->nPageSize & 0x1f) | *ppiVar2[p->iPage[1]];
            pSVar3 = p;
          }
          p->BookMarkE[1] = pSVar3->nEntries[1];
        }
      }
      return (int)local_48;
    }
    uVar9 = 2;
    while (((int)uVar9 < *p->pPages[uVar14] &&
           (__src = Sat_MemClause(p,(int)uVar14,uVar9), __src != (clause *)0x0))) {
      cVar8 = *__src;
      if (((uint)cVar8 & 1) == 0) {
        __assert_fail("c->lrn",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                      ,0x187,"int Sat_MemCompactLearned(Sat_Mem_t *, int)");
      }
      uVar7 = 1;
      if (((uint)cVar8 & 2) == 0) {
        if (bVar4) {
          *(clause *)(p->BookMarkH + 1) = __src[(ulong)((uint)cVar8 >> 0xb) + 1];
          cVar8 = *__src;
          uVar7 = (uint)cVar8 & 1;
        }
        uVar7 = ((uint)cVar8 >> 0xb) + uVar7 + 2 & 0xfffffffe;
        if (1 << ((byte)p->nPageSize & 0x1f) <= (int)(uVar7 + uVar5)) {
          if (fDoMove != 0) {
            *p->pPages[(int)uVar13] = uVar5;
          }
          uVar13 = (ulong)((int)uVar13 + 2);
          uVar5 = 2;
        }
        iVar12 = (int)uVar13;
        lVar11 = (long)iVar12;
        if (fDoMove == 0) {
          cVar8 = *__src;
          __src[(ulong)((uint)cVar8 >> 0xb) + 1] =
               (clause)(iVar12 << ((byte)p->nPageSize & 0x1f) | uVar5);
        }
        else {
          cVar8 = *__src;
          uVar10 = (ulong)((uint)cVar8 >> 0xb);
          if (__src[uVar10 + 1] != (clause)(iVar12 << ((byte)p->nPageSize & 0x1f) | uVar5)) {
            __assert_fail("c->lits[c->size] == Sat_MemHand(p, iNew, kNew)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                          ,0x1a9,"int Sat_MemCompactLearned(Sat_Mem_t *, int)");
          }
          if ((uVar14 != uVar13) || (uVar9 != uVar5)) {
            memmove(p->pPages[lVar11] + (int)uVar5,__src,(ulong)(uVar7 * 4));
            cVar8 = *(clause *)(p->pPages[lVar11] + (int)uVar5);
            uVar10 = (ulong)((uint)cVar8 >> 0xb);
            if (uVar7 != (((uint)cVar8 & 1) + ((uint)cVar8 >> 0xb) + 2 & 0xfffffffe)) {
              __assert_fail("nInts == Sat_MemClauseSize(c)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                            ,0x1b0,"int Sat_MemCompactLearned(Sat_Mem_t *, int)");
            }
            __src = (clause *)(p->pPages[lVar11] + (int)uVar5);
          }
          __src[uVar10 + 1] = local_48;
        }
        if (((long)uVar14 < lVar11) ||
           (uVar5 = uVar5 + uVar7, 1 << ((byte)p->nPageSize & 0x1f) <= (int)uVar5)) {
          __assert_fail("iNew <= i && kNew < (1 << p->nPageSize)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                        ,0x1b9,"int Sat_MemCompactLearned(Sat_Mem_t *, int)");
        }
        local_48 = (clause)((int)local_48 + 1);
        uVar7 = (uint)cVar8 & 1;
        bVar4 = false;
      }
      else if (pcVar6 == (clause *)0x0) {
        pcVar6 = (clause *)0x0;
      }
      else if (pcVar6 == __src) {
        pcVar6 = (clause *)0x0;
        bVar4 = true;
      }
      uVar9 = uVar9 + (uVar7 + ((uint)cVar8 >> 0xb) + 2 & 0xfffffffe);
    }
    uVar14 = uVar14 + 2;
  } while( true );
}

Assistant:

static inline int Sat_MemCompactLearned( Sat_Mem_t * p, int fDoMove )
{
    clause * c, * cPivot = NULL;
    int i, k, iNew = 1, kNew = 2, nInts, fStartLooking, Counter = 0;
    int hLimit = Sat_MemHandCurrent(p, 1);
    if ( hLimit == Sat_MemHand(p, 1, 2) )
        return 0;
    if ( fDoMove && p->BookMarkH[1] )
    {
        // move the pivot
        assert( p->BookMarkH[1] >= Sat_MemHand(p, 1, 2) && p->BookMarkH[1] <= hLimit );
        // get the pivot and remember it may be pointed offlimit
        cPivot = Sat_MemClauseHand( p, p->BookMarkH[1] );
        if ( p->BookMarkH[1] < hLimit && !cPivot->mark )
        {
            p->BookMarkH[1] = cPivot->lits[cPivot->size];
            cPivot = NULL;
        }
        // else find the next used clause after cPivot
    }
    // iterate through the learned clauses
    fStartLooking = 0;
    Sat_MemForEachLearned( p, c, i, k )
    {
        assert( c->lrn );
        // skip marked entry
        if ( c->mark )
        {
            // if pivot is a marked clause, start looking for the next non-marked one
            if ( cPivot && cPivot == c )
            {
                fStartLooking = 1;
                cPivot = NULL;
            }
            continue;
        }
        // if we started looking before, we found it!
        if ( fStartLooking )
        {
            fStartLooking = 0;
            p->BookMarkH[1] = c->lits[c->size];
        }
        // compute entry size
        nInts = Sat_MemClauseSize(c);
        assert( !(nInts & 1) );
        // check if we need to scroll to the next page
        if ( kNew + nInts >= (1 << p->nPageSize) )
        {
            // set the limit of the current page
            if ( fDoMove )
                Sat_MemWriteLimit( p->pPages[iNew], kNew );
            // move writing position to the new page
            iNew += 2;
            kNew = 2;
        }
        if ( fDoMove )
        {
            // make sure the result is the same as previous dry run
            assert( c->lits[c->size] == Sat_MemHand(p, iNew, kNew) );
            // only copy the clause if it has changed
            if ( i != iNew || k != kNew )
            {
                memmove( p->pPages[iNew] + kNew, c, sizeof(int) * nInts );
//                c = Sat_MemClause( p, iNew, kNew ); // assersions do not hold during dry run
                c = (clause *)(p->pPages[iNew] + kNew);
                assert( nInts == Sat_MemClauseSize(c) );
            }
            // set the new ID value
            c->lits[c->size] = Counter;
        }
        else // remember the address of the clause in the new location
            c->lits[c->size] = Sat_MemHand(p, iNew, kNew);
        // update writing position
        kNew += nInts;
        assert( iNew <= i && kNew < (1 << p->nPageSize) );
        // update counter
        Counter++;
    }
    if ( fDoMove )
    {
        // update the counter
        p->nEntries[1] = Counter;
        // update the page count
        p->iPage[1] = iNew;
        // set the limit of the last page
        Sat_MemWriteLimit( p->pPages[iNew], kNew );
        // check if the pivot need to be updated
        if ( p->BookMarkH[1] )
        {
            if ( cPivot )
            {
                p->BookMarkH[1] = Sat_MemHandCurrent(p, 1);
                p->BookMarkE[1] = p->nEntries[1];
            }
            else
                p->BookMarkE[1] = clause_id(Sat_MemClauseHand( p, p->BookMarkH[1] ));
        }

    }
    return Counter;
}